

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgmesh.cpp
# Opt level: O0

void __thiscall
TPZGeoMesh::FindElement
          (TPZGeoMesh *this,
          map<long,_TPZGeoEl_*,_std::less<long>,_std::allocator<std::pair<const_long,_TPZGeoEl_*>_>_>
          *elmap,int64_t currentnode,TPZGeoEl **candidate,int *candidateside)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  undefined8 *in_RCX;
  TPZGeoElSide *in_RDX;
  int *in_R8;
  TPZGeoElSide father;
  TPZGeoElSide neigh;
  TPZGeoElSide thisside;
  int is;
  int ns;
  TPZGeoEl *el;
  iterator iel;
  iterator ielprev;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  TPZGeoElSide *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  TPZGeoElSide local_b0;
  TPZGeoElSide local_98;
  int local_80;
  TPZGeoElSide local_70;
  int local_58;
  int local_54;
  _Base_ptr local_50;
  TPZGeoEl *local_48;
  _Self local_40;
  _Self local_38;
  _Rb_tree_iterator<std::pair<const_long,_TPZGeoEl_*>_> local_30;
  int *local_28;
  undefined8 *local_20;
  TPZGeoElSide *local_18;
  
  *in_RCX = 0;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::_Rb_tree_iterator<std::pair<const_long,_TPZGeoEl_*>_>::_Rb_tree_iterator(&local_30);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<long,_TPZGeoEl_*,_std::less<long>,_std::allocator<std::pair<const_long,_TPZGeoEl_*>_>_>::
       begin((map<long,_TPZGeoEl_*,_std::less<long>,_std::allocator<std::pair<const_long,_TPZGeoEl_*>_>_>
              *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  do {
    local_40._M_node =
         (_Base_ptr)
         std::
         map<long,_TPZGeoEl_*,_std::less<long>,_std::allocator<std::pair<const_long,_TPZGeoEl_*>_>_>
         ::end((map<long,_TPZGeoEl_*,_std::less<long>,_std::allocator<std::pair<const_long,_TPZGeoEl_*>_>_>
                *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) {
      return;
    }
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_long,_TPZGeoEl_*>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_long,_TPZGeoEl_*>_> *)0x1a27620);
    local_48 = ppVar3->second;
    local_30._M_node = local_38._M_node;
    local_50 = (_Base_ptr)
               std::_Rb_tree_iterator<std::pair<const_long,_TPZGeoEl_*>_>::operator++
                         ((_Rb_tree_iterator<std::pair<const_long,_TPZGeoEl_*>_> *)
                          CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                          (int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
    local_54 = (**(code **)(*(long *)local_48 + 0xf0))();
    local_58 = (**(code **)(*(long *)local_48 + 0x98))();
    for (; local_58 < local_54; local_58 = local_58 + 1) {
      TPZGeoElSide::TPZGeoElSide
                (&local_70,(TPZGeoEl *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)
                 ,(int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
      iVar2 = TPZGeoElSide::Dimension(in_stack_ffffffffffffff30);
      if (iVar2 < 2) {
        (**(code **)(*(long *)local_48 + 0x188))(&local_98,local_48,local_58);
        (**(code **)(*(long *)local_48 + 0x248))(&local_b0,local_48,local_58);
        in_stack_ffffffffffffff3c = TPZGeoElSide::operator==(&local_98,&local_70);
        if (((in_stack_ffffffffffffff3c == 0) ||
            (in_stack_ffffffffffffff38 = TPZGeoElSide::Exists(&local_b0),
            in_stack_ffffffffffffff38 != 0)) ||
           (in_stack_ffffffffffffff30 =
                 (TPZGeoElSide *)(**(code **)(*(long *)local_48 + 0x128))(local_48,local_58,0),
           in_stack_ffffffffffffff30 != local_18)) {
          local_80 = 0;
        }
        else {
          *local_20 = local_48;
          *local_28 = local_58;
          local_80 = 1;
        }
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1a2780e);
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1a27818);
      }
      else {
        local_80 = 6;
      }
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1a27822);
      if ((local_80 != 0) && (local_80 == 1)) {
        return;
      }
      in_stack_ffffffffffffff2c = local_80;
    }
  } while( true );
}

Assistant:

void TPZGeoMesh::FindElement(std::map<int64_t,TPZGeoEl *> &elmap,int64_t currentnode,TPZGeoEl* &candidate,int &candidateside)
{
    candidate = 0;
    //TPZPix iel = elmap.First();
    map<int64_t , TPZGeoEl *>::iterator ielprev, iel = elmap.begin();
    while(iel!=elmap.end()) {
		TPZGeoEl *el = iel->second;//elmap.Contents(iel);
		ielprev=iel;
		iel++;//elmap.Next(iel);
		int ns = el->NSides();
		int is = el->NCornerNodes();
		for(; is < ns; is++) {
			TPZGeoElSide thisside(el,is);
			if (thisside.Dimension() > 1) continue;
			TPZGeoElSide neigh = el->Neighbour(is);
			TPZGeoElSide father = el->Father2(is);
			
#ifdef PZDEBUG2
			std::stringstream sout;
			sout << __PRETTY_FUNCTION__ << " for elidx " << el->Index() << std::endl;
			sout << "\tthiside " << el->Index() << "/" << is << std::endl;
			if (neigh.Element()) sout << "\tneighsd " << neigh.Element()->Index() << "/" << neigh.Side() << std::endl;
			if (father.Element())sout << "\tfathers " << father.Element()->Index() << "/" << father.Side() << std::endl;
#endif
			
			if(neigh == thisside && !father.Exists() && el->SideNodeIndex(is,0) == currentnode) {
				candidate = el;
				candidateside = is;
				
#ifdef PZDEBUG2
				sout << "\t\t\tNew Candidate found el/side = " << el << "/" << is << std::endl;
				LOGPZ_DEBUG (logger,sout.str().c_str());
#endif
				
				return;
			}
			
#ifdef PZDEBUG2
			else
			{
				sout << "candidate doesn't match...";
				LOGPZ_DEBUG(logger,sout.str().c_str());
			}
#endif
		}
	}
	
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "No neighbour found for node " << currentnode << " elmap \n";
		for(iel=elmap.begin(); iel!=elmap.end(); iel++)
		{
			iel->second->Print(sout);
		}
		LOGPZ_WARN(logger,sout.str());
	}
#endif
	
}